

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

void PcodeCompile::matchSize
               (int4 j,OpTpl *op,bool inputonly,vector<OpTpl_*,_std::allocator<OpTpl_*>_> *ops)

{
  VarnodeTpl *pVVar1;
  pointer ppVVar2;
  VarnodeTpl *pVVar3;
  OpTpl *pOVar4;
  long lVar5;
  
  pOVar4 = op;
  if (j != -1) {
    pOVar4 = (OpTpl *)((op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + j);
  }
  if ((inputonly) || (pVVar1 = op->output, pVVar1 == (VarnodeTpl *)0x0)) {
    pVVar3 = (VarnodeTpl *)0x0;
  }
  else {
    pVVar3 = (VarnodeTpl *)(pVVar1->size).value_real;
    if (pVVar3 != (VarnodeTpl *)0x0) {
      pVVar3 = pVVar1;
    }
    if ((pVVar1->size).type != real) {
      pVVar3 = pVVar1;
    }
  }
  ppVVar2 = (op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar5 = 0;
  while ((lVar5 < (int)((ulong)((long)(op->input).
                                      super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2) >>
                       3) && (pVVar3 == (VarnodeTpl *)0x0))) {
    pVVar1 = ppVVar2[lVar5];
    pVVar3 = (VarnodeTpl *)(pVVar1->size).value_real;
    if (pVVar3 != (VarnodeTpl *)0x0) {
      pVVar3 = pVVar1;
    }
    if ((pVVar1->size).type != real) {
      pVVar3 = pVVar1;
    }
    lVar5 = lVar5 + 1;
  }
  if (pVVar3 == (VarnodeTpl *)0x0) {
    return;
  }
  force_size(pOVar4->output,&pVVar3->size,ops);
  return;
}

Assistant:

void PcodeCompile::matchSize(int4 j,OpTpl *op,bool inputonly,const vector<OpTpl *> &ops)

{				// Find something to fill in zero size varnode
				// j is the slot we are trying to fill (-1=output)
				// Don't check output for non-zero if inputonly is true
  VarnodeTpl *match = (VarnodeTpl *)0;
  VarnodeTpl *vt;
  int4 i,inputsize;

  vt = (j==-1) ? op->getOut() : op->getIn(j);
  if (!inputonly) {
    if (op->getOut() != (VarnodeTpl *)0)
      if (!op->getOut()->isZeroSize())
	match = op->getOut();
  }
  inputsize = op->numInput();
  for(i=0;i<inputsize;++i) {
    if (match != (VarnodeTpl *)0) break;
    if (op->getIn(i)->isZeroSize()) continue;
    match = op->getIn(i);
  }
  if (match != (VarnodeTpl *)0)
    force_size(vt,match->getSize(),ops);
}